

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dark_magic.h
# Opt level: O2

void cplus::memory::copy<cplus::memory::Test>(Test *a,Test *b)

{
  long lVar1;
  char *swapB;
  char *swapA;
  
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 1) {
    *(undefined1 *)((long)&(b->super_Object)._vptr_Object + lVar1) =
         *(undefined1 *)((long)&(a->super_Object)._vptr_Object + lVar1);
  }
  return;
}

Assistant:

void copy(const T &a, const T &b) {
			char *swapA = (char *) &a;
			char *swapB = (char *) &b;
			for (size_t loopTIme = sizeof(a); loopTIme > 0; loopTIme--) {
				(*swapB) = (*swapA);
				++swapA;
				++swapB;
			}
		}